

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_vtlb.c
# Opt level: O0

uc_mem_type rw_to_mem_type(int rw)

{
  undefined4 local_c;
  int rw_local;
  
  if (rw == 0) {
    local_c = UC_MEM_READ;
  }
  else if (rw == 1) {
    local_c = UC_MEM_WRITE;
  }
  else if (rw == 2) {
    local_c = UC_MEM_FETCH;
  }
  else {
    local_c = UC_MEM_READ;
  }
  return local_c;
}

Assistant:

static uc_mem_type rw_to_mem_type(int rw)
{
    switch (rw) {
    case MMU_DATA_LOAD:
        return UC_MEM_READ;
    case MMU_DATA_STORE:
        return UC_MEM_WRITE;
    case MMU_INST_FETCH:
        return UC_MEM_FETCH;
    default:
        return UC_MEM_READ;
    }
}